

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpge.cpp
# Opt level: O2

bool __thiscall
jpge::jpeg_encoder::jpg_open(jpeg_encoder *this,int p_x_res,int p_y_res,int src_channels)

{
  int32 (*pDst) [64];
  uint8 (*pauVar1) [17];
  uint8 (*pauVar2) [256];
  undefined1 uVar3;
  uint uVar4;
  uint8 *puVar5;
  undefined1 *pSrc;
  int iVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  
  this->m_num_components = '\x03';
  switch((this->m_params).m_subsampling) {
  case Y_ONLY:
    this->m_num_components = '\x01';
    this->m_comp_h_samp[0] = '\x01';
    this->m_comp_v_samp[0] = '\x01';
    this->m_mcu_x = 8;
    this->m_mcu_y = 8;
    iVar8 = 8;
    iVar6 = 1;
    iVar9 = iVar8;
    goto LAB_00142634;
  case H1V1:
    this->m_comp_v_samp[1] = '\x01';
    this->m_comp_v_samp[2] = '\x01';
    this->m_comp_h_samp[0] = '\x01';
    this->m_comp_h_samp[1] = '\x01';
    this->m_comp_h_samp[2] = '\x01';
    this->m_comp_v_samp[0] = '\x01';
    this->m_mcu_x = 8;
    this->m_mcu_y = 8;
    iVar8 = 8;
    break;
  case H2V1:
    this->m_comp_h_samp[0] = '\x02';
    *(undefined4 *)(this->m_comp_h_samp + 1) = 0x1010101;
    this->m_comp_v_samp[2] = '\x01';
    this->m_mcu_x = 0x10;
    this->m_mcu_y = 8;
    iVar8 = 0x10;
    iVar9 = 8;
    goto LAB_00142631;
  case H2V2:
    this->m_comp_v_samp[1] = '\x01';
    this->m_comp_v_samp[2] = '\x01';
    this->m_comp_h_samp[0] = '\x02';
    this->m_comp_h_samp[1] = '\x01';
    this->m_comp_h_samp[2] = '\x01';
    this->m_comp_v_samp[0] = '\x02';
    this->m_mcu_x = 0x10;
    this->m_mcu_y = 0x10;
    iVar8 = 0x10;
    break;
  default:
    iVar8 = this->m_mcu_x;
    iVar9 = this->m_mcu_y;
LAB_00142631:
    iVar6 = 3;
    goto LAB_00142634;
  }
  iVar6 = 3;
  iVar9 = iVar8;
LAB_00142634:
  this->m_image_x = p_x_res;
  this->m_image_y = p_y_res;
  this->m_image_bpp = src_channels;
  this->m_image_bpl = src_channels * p_x_res;
  uVar4 = -iVar8 & (p_x_res + iVar8) - 1U;
  this->m_image_x_mcu = uVar4;
  this->m_image_y_mcu = -iVar9 & (p_y_res + iVar9) - 1U;
  this->m_image_bpl_xlt = p_x_res * iVar6;
  iVar6 = iVar6 * uVar4;
  this->m_image_bpl_mcu = iVar6;
  this->m_mcus_per_row = (int)uVar4 / iVar8;
  puVar5 = (uint8 *)malloc((long)(iVar6 * iVar9));
  this->m_mcu_lines[0] = puVar5;
  if (puVar5 == (uint8 *)0x0) {
    uVar3 = 0;
  }
  else {
    for (lVar7 = 10; puVar5 = puVar5 + iVar6, lVar7 + -9 < (long)iVar9; lVar7 = lVar7 + 1) {
      *(uint8 **)(this->m_comp_h_samp + lVar7 * 8 + -0x15) = puVar5;
    }
    pDst = this->m_quantization_tables;
    if ((this->m_params).m_use_std_tables == false) {
      compute_quant_table(this,*pDst,(int16 *)s_alt_quant);
      memcpy(this->m_quantization_tables + 1,pDst,0x100);
    }
    else {
      compute_quant_table(this,*pDst,(int16 *)s_std_lum_quant);
      pSrc = s_std_croma_quant;
      if ((this->m_params).m_no_chroma_discrim_flag != false) {
        pSrc = s_std_lum_quant;
      }
      compute_quant_table(this,this->m_quantization_tables[1],(int16 *)pSrc);
    }
    this->m_out_buf_left = 0x800;
    this->m_pOut_buf = this->m_out_buf;
    if ((this->m_params).m_two_pass_flag == true) {
      this->m_bit_buffer = 0;
      this->m_bits_in = 0;
      this->m_mcu_y_ofs = '\0';
      memset(this->m_huff_count,0,0x100c);
      this->m_pass_num = '\x01';
    }
    else {
      *(uint8 *)((long)(this->m_huff_bits + 0) + 0) = '\0';
      *(uint8 *)((long)(this->m_huff_bits + 0) + 1) = '\0';
      *(uint8 *)((long)(this->m_huff_bits + 0) + 2) = '\x01';
      *(uint8 *)((long)(this->m_huff_bits + 0) + 3) = '\x05';
      *(uint8 *)((long)(this->m_huff_bits + 0) + 4) = '\x01';
      *(uint8 *)((long)(this->m_huff_bits + 0) + 5) = '\x01';
      *(uint8 *)((long)(this->m_huff_bits + 0) + 6) = '\x01';
      *(uint8 *)((long)(this->m_huff_bits + 0) + 7) = '\x01';
      *(uint8 *)((long)(this->m_huff_bits + 0) + 8) = '\x01';
      *(uint8 *)((long)(this->m_huff_bits + 0) + 9) = '\x01';
      *(uint8 *)((long)(this->m_huff_bits + 0) + 10) = '\0';
      *(uint8 *)((long)(this->m_huff_bits + 0) + 0xb) = '\0';
      *(uint8 *)((long)(this->m_huff_bits + 0) + 0xc) = '\0';
      *(uint8 *)((long)(this->m_huff_bits + 0) + 0xd) = '\0';
      *(uint8 *)((long)(this->m_huff_bits + 0) + 0xe) = '\0';
      *(uint8 *)((long)(this->m_huff_bits + 0) + 0xf) = '\0';
      this->m_huff_bits[0][0x10] = '\0';
      *(uint8 *)((long)(this->m_huff_val + 0) + 0) = '\0';
      *(uint8 *)((long)(this->m_huff_val + 0) + 1) = '\x01';
      *(uint8 *)((long)(this->m_huff_val + 0) + 2) = '\x02';
      *(uint8 *)((long)(this->m_huff_val + 0) + 3) = '\x03';
      *(uint8 *)((long)(this->m_huff_val + 0) + 4) = '\x04';
      *(uint8 *)((long)(this->m_huff_val + 0) + 5) = '\x05';
      *(uint8 *)((long)(this->m_huff_val + 0) + 6) = '\x06';
      *(uint8 *)((long)(this->m_huff_val + 0) + 7) = '\a';
      *(uint8 *)((long)(this->m_huff_val + 0) + 8) = '\b';
      *(uint8 *)((long)(this->m_huff_val + 0) + 9) = '\t';
      *(uint8 *)((long)(this->m_huff_val + 0) + 10) = '\n';
      *(uint8 *)((long)(this->m_huff_val + 0) + 0xb) = '\v';
      *(uint8 *)((long)(this->m_huff_bits + 2) + 0) = '\0';
      *(uint8 *)((long)(this->m_huff_bits + 2) + 1) = '\0';
      *(uint8 *)((long)(this->m_huff_bits + 2) + 2) = '\x02';
      *(uint8 *)((long)(this->m_huff_bits + 2) + 3) = '\x01';
      *(uint8 *)((long)(this->m_huff_bits + 2) + 4) = '\x03';
      *(uint8 *)((long)(this->m_huff_bits + 2) + 5) = '\x03';
      *(uint8 *)((long)(this->m_huff_bits + 2) + 6) = '\x02';
      *(uint8 *)((long)(this->m_huff_bits + 2) + 7) = '\x04';
      pauVar1 = this->m_huff_bits;
      *(uint8 *)((long)(pauVar1 + 2) + 8) = '\x03';
      *(uint8 *)((long)(pauVar1 + 2) + 9) = '\x05';
      *(uint8 *)((long)(pauVar1 + 2) + 10) = '\x05';
      *(uint8 *)((long)(pauVar1 + 2) + 0xb) = '\x04';
      *(uint8 *)((long)(pauVar1 + 2) + 0xc) = '\x04';
      *(uint8 *)((long)(pauVar1 + 2) + 0xd) = '\0';
      *(uint8 *)((long)(pauVar1 + 2) + 0xe) = '\0';
      *(uint8 *)((long)(pauVar1 + 2) + 0xf) = '\x01';
      this->m_huff_bits[2][0x10] = '}';
      memcpy(this->m_huff_val + 2,s_ac_lum_val,0x100);
      this->m_huff_bits[1][0x10] = '\0';
      *(uint8 *)((long)(this->m_huff_bits + 1) + 0) = '\0';
      *(uint8 *)((long)(this->m_huff_bits + 1) + 1) = '\0';
      *(uint8 *)((long)(this->m_huff_bits + 1) + 2) = '\x03';
      *(uint8 *)((long)(this->m_huff_bits + 1) + 3) = '\x01';
      *(uint8 *)((long)(this->m_huff_bits + 1) + 4) = '\x01';
      *(uint8 *)((long)(this->m_huff_bits + 1) + 5) = '\x01';
      *(uint8 *)((long)(this->m_huff_bits + 1) + 6) = '\x01';
      *(uint8 *)((long)(this->m_huff_bits + 1) + 7) = '\x01';
      pauVar1 = this->m_huff_bits;
      *(uint8 *)((long)(pauVar1 + 1) + 8) = '\x01';
      *(uint8 *)((long)(pauVar1 + 1) + 9) = '\x01';
      *(uint8 *)((long)(pauVar1 + 1) + 10) = '\x01';
      *(uint8 *)((long)(pauVar1 + 1) + 0xb) = '\x01';
      *(uint8 *)((long)(pauVar1 + 1) + 0xc) = '\0';
      *(uint8 *)((long)(pauVar1 + 1) + 0xd) = '\0';
      *(uint8 *)((long)(pauVar1 + 1) + 0xe) = '\0';
      *(uint8 *)((long)(pauVar1 + 1) + 0xf) = '\0';
      *(uint8 *)((long)(this->m_huff_val + 1) + 0) = '\0';
      *(uint8 *)((long)(this->m_huff_val + 1) + 1) = '\x01';
      *(uint8 *)((long)(this->m_huff_val + 1) + 2) = '\x02';
      *(uint8 *)((long)(this->m_huff_val + 1) + 3) = '\x03';
      *(uint8 *)((long)(this->m_huff_val + 1) + 4) = '\x04';
      *(uint8 *)((long)(this->m_huff_val + 1) + 5) = '\x05';
      *(uint8 *)((long)(this->m_huff_val + 1) + 6) = '\x06';
      *(uint8 *)((long)(this->m_huff_val + 1) + 7) = '\a';
      pauVar2 = this->m_huff_val;
      *(uint8 *)((long)(pauVar2 + 1) + 8) = '\b';
      *(uint8 *)((long)(pauVar2 + 1) + 9) = '\t';
      *(uint8 *)((long)(pauVar2 + 1) + 10) = '\n';
      *(uint8 *)((long)(pauVar2 + 1) + 0xb) = '\v';
      *(uint8 *)((long)(this->m_huff_bits + 3) + 0) = '\0';
      *(uint8 *)((long)(this->m_huff_bits + 3) + 1) = '\0';
      *(uint8 *)((long)(this->m_huff_bits + 3) + 2) = '\x02';
      *(uint8 *)((long)(this->m_huff_bits + 3) + 3) = '\x01';
      *(uint8 *)((long)(this->m_huff_bits + 3) + 4) = '\x02';
      *(uint8 *)((long)(this->m_huff_bits + 3) + 5) = '\x04';
      *(uint8 *)((long)(this->m_huff_bits + 3) + 6) = '\x04';
      *(uint8 *)((long)(this->m_huff_bits + 3) + 7) = '\x03';
      pauVar1 = this->m_huff_bits;
      *(uint8 *)((long)(pauVar1 + 3) + 8) = '\x04';
      *(uint8 *)((long)(pauVar1 + 3) + 9) = '\a';
      *(uint8 *)((long)(pauVar1 + 3) + 10) = '\x05';
      *(uint8 *)((long)(pauVar1 + 3) + 0xb) = '\x04';
      *(uint8 *)((long)(pauVar1 + 3) + 0xc) = '\x04';
      *(uint8 *)((long)(pauVar1 + 3) + 0xd) = '\0';
      *(uint8 *)((long)(pauVar1 + 3) + 0xe) = '\x01';
      *(uint8 *)((long)(pauVar1 + 3) + 0xf) = '\x02';
      this->m_huff_bits[3][0x10] = 'w';
      memcpy(this->m_huff_val + 3,s_ac_chroma_val,0x100);
      second_pass_init(this);
    }
    uVar3 = this->m_all_stream_writes_succeeded;
  }
  return (bool)uVar3;
}

Assistant:

bool jpeg_encoder::jpg_open(int p_x_res, int p_y_res, int src_channels)
	{
		m_num_components = 3;
		switch (m_params.m_subsampling)
		{
		case Y_ONLY:
		{
			m_num_components = 1;
			m_comp_h_samp[0] = 1; m_comp_v_samp[0] = 1;
			m_mcu_x = 8; m_mcu_y = 8;
			break;
		}
		case H1V1:
		{
			m_comp_h_samp[0] = 1; m_comp_v_samp[0] = 1;
			m_comp_h_samp[1] = 1; m_comp_v_samp[1] = 1;
			m_comp_h_samp[2] = 1; m_comp_v_samp[2] = 1;
			m_mcu_x = 8; m_mcu_y = 8;
			break;
		}
		case H2V1:
		{
			m_comp_h_samp[0] = 2; m_comp_v_samp[0] = 1;
			m_comp_h_samp[1] = 1; m_comp_v_samp[1] = 1;
			m_comp_h_samp[2] = 1; m_comp_v_samp[2] = 1;
			m_mcu_x = 16; m_mcu_y = 8;
			break;
		}
		case H2V2:
		{
			m_comp_h_samp[0] = 2; m_comp_v_samp[0] = 2;
			m_comp_h_samp[1] = 1; m_comp_v_samp[1] = 1;
			m_comp_h_samp[2] = 1; m_comp_v_samp[2] = 1;
			m_mcu_x = 16; m_mcu_y = 16;
		}
		}

		m_image_x = p_x_res; m_image_y = p_y_res;
		m_image_bpp = src_channels;
		m_image_bpl = m_image_x * src_channels;
		m_image_x_mcu = (m_image_x + m_mcu_x - 1) & (~(m_mcu_x - 1));
		m_image_y_mcu = (m_image_y + m_mcu_y - 1) & (~(m_mcu_y - 1));
		m_image_bpl_xlt = m_image_x * m_num_components;
		m_image_bpl_mcu = m_image_x_mcu * m_num_components;
		m_mcus_per_row = m_image_x_mcu / m_mcu_x;

		if ((m_mcu_lines[0] = static_cast<uint8*>(jpge_malloc(m_image_bpl_mcu * m_mcu_y))) == NULL) return false;
		for (int i = 1; i < m_mcu_y; i++)
			m_mcu_lines[i] = m_mcu_lines[i - 1] + m_image_bpl_mcu;

		if (m_params.m_use_std_tables)
		{
			compute_quant_table(m_quantization_tables[0], s_std_lum_quant);
			compute_quant_table(m_quantization_tables[1], m_params.m_no_chroma_discrim_flag ? s_std_lum_quant : s_std_croma_quant);
		}
		else
		{
			compute_quant_table(m_quantization_tables[0], s_alt_quant);
			memcpy(m_quantization_tables[1], m_quantization_tables[0], sizeof(m_quantization_tables[1]));
		}

		m_out_buf_left = JPGE_OUT_BUF_SIZE;
		m_pOut_buf = m_out_buf;

		if (m_params.m_two_pass_flag)
		{
			clear_obj(m_huff_count);
			first_pass_init();
		}
		else
		{
			memcpy(m_huff_bits[0 + 0], s_dc_lum_bits, 17);    memcpy(m_huff_val[0 + 0], s_dc_lum_val, DC_LUM_CODES);
			memcpy(m_huff_bits[2 + 0], s_ac_lum_bits, 17);    memcpy(m_huff_val[2 + 0], s_ac_lum_val, AC_LUM_CODES);
			memcpy(m_huff_bits[0 + 1], s_dc_chroma_bits, 17); memcpy(m_huff_val[0 + 1], s_dc_chroma_val, DC_CHROMA_CODES);
			memcpy(m_huff_bits[2 + 1], s_ac_chroma_bits, 17); memcpy(m_huff_val[2 + 1], s_ac_chroma_val, AC_CHROMA_CODES);
			if (!second_pass_init()) return false;   // in effect, skip over the first pass
		}
		return m_all_stream_writes_succeeded;
	}